

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O2

void amrex::Arena::Finalize(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = Verbose();
  if (1 < iVar1) {
    PrintUsage();
  }
  lVar3 = (anonymous_namespace)::the_device_arena;
  lVar4 = (anonymous_namespace)::the_arena;
  (anonymous_namespace)::initialized = 0;
  if ((anonymous_namespace)::the_device_arena == 0) {
LAB_004114d7:
    (anonymous_namespace)::the_device_arena = 0;
  }
  else {
    lVar2 = __dynamic_cast((anonymous_namespace)::the_device_arena,&typeinfo,&BArena::typeinfo,0);
    if (lVar2 == 0) {
      if (lVar3 != lVar4) {
        (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[1])(lVar3);
        lVar4 = (anonymous_namespace)::the_arena;
      }
      goto LAB_004114d7;
    }
  }
  lVar3 = (anonymous_namespace)::the_managed_arena;
  if ((anonymous_namespace)::the_managed_arena == 0) {
LAB_00411521:
    (anonymous_namespace)::the_managed_arena = 0;
  }
  else {
    lVar2 = __dynamic_cast((anonymous_namespace)::the_managed_arena,&typeinfo,&BArena::typeinfo,0);
    if (lVar2 == 0) {
      if (lVar3 != lVar4) {
        (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[1])(lVar3);
        lVar4 = (anonymous_namespace)::the_arena;
      }
      goto LAB_00411521;
    }
  }
  if (lVar4 != 0) {
    lVar3 = __dynamic_cast(lVar4,&typeinfo,&BArena::typeinfo,0);
    if (lVar3 != 0) goto LAB_00411560;
    (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[1])(lVar4);
  }
  (anonymous_namespace)::the_arena = 0;
LAB_00411560:
  if ((anonymous_namespace)::the_async_arena != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::the_async_arena + 8))();
  }
  (anonymous_namespace)::the_async_arena = (long *)0x0;
  if ((anonymous_namespace)::the_pinned_arena != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::the_pinned_arena + 8))();
  }
  lVar4 = (anonymous_namespace)::the_cpu_arena;
  (anonymous_namespace)::the_pinned_arena = (long *)0x0;
  if ((anonymous_namespace)::the_cpu_arena != 0) {
    lVar3 = __dynamic_cast((anonymous_namespace)::the_cpu_arena,&typeinfo,&BArena::typeinfo,0);
    if (lVar3 != 0) {
      return;
    }
    (*anon_unknown_4::The_BArena::the_barena.super_Arena._vptr_Arena[1])(lVar4);
  }
  (anonymous_namespace)::the_cpu_arena = 0;
  return;
}

Assistant:

void
Arena::Finalize ()
{
#ifdef AMREX_USE_GPU
    if (amrex::Verbose() > 0) {
#else
    if (amrex::Verbose() > 1) {
#endif
        PrintUsage();
    }

    initialized = false;

    if (!dynamic_cast<BArena*>(the_device_arena)) {
        if (the_device_arena != the_arena) {
            delete the_device_arena;
        }
        the_device_arena = nullptr;
    }

    if (!dynamic_cast<BArena*>(the_managed_arena)) {
        if (the_managed_arena != the_arena) {
            delete the_managed_arena;
        }
        the_managed_arena = nullptr;
    }

    if (!dynamic_cast<BArena*>(the_arena)) {
        delete the_arena;
        the_arena = nullptr;
    }

    delete the_async_arena;
    the_async_arena = nullptr;

    delete the_pinned_arena;
    the_pinned_arena = nullptr;

    if (!dynamic_cast<BArena*>(the_cpu_arena)) {
        delete the_cpu_arena;
        the_cpu_arena = nullptr;
    }
}

Arena*
The_Arena ()
{
    if        (the_arena) {
        return the_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Async_Arena ()
{
    if        (the_async_arena) {
        return the_async_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Device_Arena ()
{
    if        (the_device_arena) {
        return the_device_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Managed_Arena ()
{
    if        (the_managed_arena) {
        return the_managed_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Pinned_Arena ()
{
    if        (the_pinned_arena) {
        return the_pinned_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Cpu_Arena ()
{
    if        (the_cpu_arena) {
        return the_cpu_arena;
    } else {
        return The_Null_Arena();
    }
}

}